

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

RandomBernoulliLikeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_randombernoullilike(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x4ba) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x4ba;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    RandomBernoulliLikeLayerParams::RandomBernoulliLikeLayerParams(this_00.randombernoullilike_);
    (this->layer_).randombernoullilike_ = (RandomBernoulliLikeLayerParams *)this_00;
  }
  return (RandomBernoulliLikeLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomBernoulliLikeLayerParams* NeuralNetworkLayer::mutable_randombernoullilike() {
  if (!has_randombernoullilike()) {
    clear_layer();
    set_has_randombernoullilike();
    layer_.randombernoullilike_ = new ::CoreML::Specification::RandomBernoulliLikeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.randomBernoulliLike)
  return layer_.randombernoullilike_;
}